

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void zng_tr_flush_block(deflate_state *s,char *buf,uint32_t stored_len,int last)

{
  ushort uVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  ct_data *tree;
  ct_data *tree_00;
  uint uVar11;
  uint64_t val;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar28;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar14;
  
  if (s->sym_next == 0) {
    s->static_len = 7;
    if (buf != (char *)0x0 && stored_len == 0xfffffffc) goto LAB_0010c938;
LAB_0010c953:
    uVar5 = s->bi_valid;
    uVar9 = s->bi_buf;
    uVar7 = (ulong)(last + 2U);
    uVar11 = uVar5 + 3;
    bVar8 = (byte)uVar5;
    if ((uVar11 | uVar5) < 0x40) {
      uVar7 = uVar7 << (bVar8 & 0x3f) | uVar9;
    }
    else if (uVar5 < 0x40) {
      *(ulong *)(s->pending_buf + s->pending) = uVar7 << (bVar8 & 0x3f) | uVar9;
      s->pending = s->pending + 8;
      uVar7 = (ulong)(last + 2U >> (-bVar8 & 0x3f));
      uVar11 = uVar5 - 0x3d;
    }
    else {
      *(ulong *)(s->pending_buf + s->pending) = uVar9;
      s->pending = s->pending + 8;
      uVar11 = 3;
    }
    s->bi_valid = uVar11;
    s->bi_buf = uVar7;
    tree_00 = static_ltree;
    tree = static_dtree;
  }
  else {
    if (s->level < 1) {
      uVar7 = (ulong)(stored_len + 5);
      uVar11 = 0;
      uVar9 = uVar7;
    }
    else {
      if (s->strm->data_type == 2) {
        uVar9 = 0xf3ffc07f;
        lVar10 = 0;
        do {
          if (((uVar9 & 1) != 0) && (s->dyn_ltree[lVar10].fc.freq != 0)) {
            iVar6 = 0;
            goto LAB_0010c85c;
          }
          lVar10 = lVar10 + 1;
          uVar9 = uVar9 >> 1;
        } while (lVar10 != 0x20);
        if (((s->dyn_ltree[9].fc.freq == 0) && (s->dyn_ltree[10].fc.freq == 0)) &&
           (s->dyn_ltree[0xd].fc.freq == 0)) {
          lVar10 = 0;
          iVar6 = 0;
          do {
            if (s->dyn_ltree[lVar10 + 0x20].fc.freq != 0) goto LAB_0010c845;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0xe0);
        }
        else {
LAB_0010c845:
          iVar6 = 1;
        }
LAB_0010c85c:
        s->strm->data_type = iVar6;
      }
      build_tree(s,&s->l_desc);
      build_tree(s,&s->d_desc);
      scan_tree(s,s->dyn_ltree,(s->l_desc).max_code);
      scan_tree(s,s->dyn_dtree,(s->d_desc).max_code);
      build_tree(s,&s->bl_desc);
      uVar9 = 0x12;
      do {
        uVar11 = (uint)uVar9;
        if (s->bl_tree["\x10\x11\x12"[uVar9]].dl.dad != 0) goto LAB_0010c8e2;
        uVar9 = (ulong)(uVar11 - 1);
      } while (3 < uVar11);
      uVar11 = 2;
LAB_0010c8e2:
      uVar2 = s->opt_len;
      s->opt_len = uVar2 + (long)(int)uVar11 * 3 + 0x11;
      uVar9 = (long)(int)uVar11 * 3 + uVar2 + 0x1b >> 3;
      uVar7 = s->static_len + 10 >> 3;
      if ((uVar7 <= uVar9) || (s->strategy == 4)) {
        uVar9 = uVar7;
      }
    }
    if ((buf != (char *)0x0) && (stored_len + 4 <= uVar9)) {
LAB_0010c938:
      zng_tr_stored_block(s,buf,stored_len,last);
      goto LAB_0010cc6b;
    }
    if (uVar7 == uVar9) goto LAB_0010c953;
    uVar4 = s->bi_valid;
    uVar9 = s->bi_buf;
    uVar7 = (ulong)(last + 4U);
    uVar5 = uVar4 + 3;
    bVar8 = (byte)uVar4;
    if ((uVar5 | uVar4) < 0x40) {
      uVar7 = uVar7 << (bVar8 & 0x3f) | uVar9;
    }
    else if (uVar4 < 0x40) {
      *(ulong *)(s->pending_buf + s->pending) = uVar7 << (bVar8 & 0x3f) | uVar9;
      s->pending = s->pending + 8;
      uVar7 = (ulong)(last + 4U >> (-bVar8 & 0x3f));
      uVar5 = uVar4 - 0x3d;
    }
    else {
      *(ulong *)(s->pending_buf + s->pending) = uVar9;
      s->pending = s->pending + 8;
      uVar5 = 3;
    }
    s->bi_valid = uVar5;
    s->bi_buf = uVar7;
    iVar6 = (s->l_desc).max_code;
    iVar28 = (s->d_desc).max_code;
    uVar12 = (ulong)iVar28;
    uVar9 = (long)iVar6 - 0x100;
    uVar4 = uVar5 + 5;
    bVar8 = (byte)uVar5;
    if ((uVar4 | uVar5) < 0x40) {
      uVar9 = uVar9 << (bVar8 & 0x3f) | uVar7;
LAB_0010cac7:
      uVar5 = uVar4 + 5;
      if ((uVar5 | uVar4) < 0x40) goto LAB_0010cad3;
      if (uVar4 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar12 << ((byte)uVar4 & 0x3f) | uVar9;
        s->pending = s->pending + 8;
        uVar12 = uVar12 >> (-(byte)uVar4 & 0x3f);
        uVar5 = uVar4 - 0x3b;
        goto LAB_0010cb34;
      }
      *(ulong *)(s->pending_buf + s->pending) = uVar9;
      s->pending = s->pending + 8;
      uVar9 = (long)(int)uVar11 - 3;
      uVar5 = 5;
      uVar4 = 9;
LAB_0010cb47:
      uVar9 = uVar9 << ((byte)uVar5 & 0x3f) | uVar12;
    }
    else {
      if (uVar5 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar9 << (bVar8 & 0x3f) | uVar7;
        s->pending = s->pending + 8;
        uVar9 = uVar9 >> (-bVar8 & 0x3f);
        uVar4 = uVar5 - 0x3b;
        goto LAB_0010cac7;
      }
      *(ulong *)(s->pending_buf + s->pending) = uVar7;
      s->pending = s->pending + 8;
      uVar4 = 5;
      uVar5 = 10;
LAB_0010cad3:
      uVar12 = uVar12 << ((byte)uVar4 & 0x3f) | uVar9;
LAB_0010cb34:
      uVar9 = (long)(int)uVar11 - 3;
      uVar4 = uVar5 + 4;
      if ((uVar4 | uVar5) < 0x40) goto LAB_0010cb47;
      if (uVar5 < 0x40) {
        *(ulong *)(s->pending_buf + s->pending) = uVar9 << ((byte)uVar5 & 0x3f) | uVar12;
        s->pending = s->pending + 8;
        uVar9 = uVar9 >> (-(byte)uVar5 & 0x3f);
        uVar4 = uVar5 - 0x3c;
      }
      else {
        *(ulong *)(s->pending_buf + s->pending) = uVar12;
        s->pending = s->pending + 8;
        uVar4 = 4;
      }
    }
    if (-1 < (int)uVar11) {
      uVar7 = 0;
      do {
        uVar1 = s->bl_tree["\x10\x11\x12"[uVar7]].dl.dad;
        uVar12 = (ulong)uVar1;
        bVar8 = (byte)uVar4;
        if ((uVar4 + 3 | uVar4) < 0x40) {
          uVar9 = uVar12 << (bVar8 & 0x3f) | uVar9;
          uVar4 = uVar4 + 3;
        }
        else if (uVar4 < 0x40) {
          *(ulong *)(s->pending_buf + s->pending) = uVar12 << (bVar8 & 0x3f) | uVar9;
          s->pending = s->pending + 8;
          uVar4 = uVar4 - 0x3d;
          uVar9 = (ulong)(uVar1 >> (-bVar8 & 0x3f));
        }
        else {
          *(ulong *)(s->pending_buf + s->pending) = uVar9;
          s->pending = s->pending + 8;
          uVar4 = 3;
          uVar9 = uVar12;
        }
        uVar7 = uVar7 + 1;
      } while (uVar11 + 1 != uVar7);
    }
    s->bi_buf = uVar9;
    s->bi_valid = uVar4;
    tree_00 = s->dyn_ltree;
    send_tree(s,tree_00,iVar6);
    tree = s->dyn_dtree;
    send_tree(s,tree,iVar28);
  }
  compress_block(s,tree_00,tree);
LAB_0010cc6b:
  auVar3 = _DAT_0011a410;
  lVar10 = 0x48;
  auVar33 = _DAT_0011b170;
  auVar16 = _DAT_0011b180;
  auVar18 = _DAT_0011a3f0;
  auVar20 = _DAT_0011a400;
  do {
    auVar22 = auVar20 ^ auVar3;
    iVar6 = auVar22._0_4_;
    iVar28 = auVar22._8_4_;
    auVar29._4_4_ = iVar6;
    auVar29._0_4_ = iVar6;
    auVar29._8_4_ = iVar28;
    auVar29._12_4_ = iVar28;
    auVar38._0_4_ = -(uint)(iVar6 < -0x7ffffee2);
    auVar38._4_4_ = -(uint)(iVar6 < -0x7ffffee2);
    auVar38._8_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar38._12_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar23._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar38;
    auVar22 = pshuflw(auVar29,auVar23,0xe8);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar10 * 4 + -0x1c) = 0;
    }
    auVar22 = packssdw(auVar23,auVar23);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
      *(undefined2 *)((long)s + lVar10 * 4 + -0x18) = 0;
    }
    auVar22 = auVar18 ^ auVar3;
    iVar6 = auVar22._0_4_;
    iVar28 = auVar22._8_4_;
    auVar30._4_4_ = iVar6;
    auVar30._0_4_ = iVar6;
    auVar30._8_4_ = iVar28;
    auVar30._12_4_ = iVar28;
    auVar39._0_4_ = -(uint)(iVar6 < -0x7ffffee2);
    auVar39._4_4_ = -(uint)(iVar6 < -0x7ffffee2);
    auVar39._8_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar39._12_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar24._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar24._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar24._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar24._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar24 = auVar24 & auVar39;
    auVar22 = packssdw(auVar30,auVar24);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar10 * 4 + -0x14) = 0;
    }
    auVar22 = pshufhw(auVar24,auVar24,0x84);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar10 * 4 + -0x10) = 0;
    }
    auVar22 = auVar16 ^ auVar3;
    iVar6 = auVar22._0_4_;
    iVar28 = auVar22._8_4_;
    auVar31._4_4_ = iVar6;
    auVar31._0_4_ = iVar6;
    auVar31._8_4_ = iVar28;
    auVar31._12_4_ = iVar28;
    auVar40._0_4_ = -(uint)(iVar6 < -0x7ffffee2);
    auVar40._4_4_ = -(uint)(iVar6 < -0x7ffffee2);
    auVar40._8_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar40._12_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar25._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar40;
    auVar22 = pshuflw(auVar31,auVar25,0xe8);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar10 * 4 + -0xc) = 0;
    }
    auVar22 = packssdw(auVar25,auVar25);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar10 * 4 + -8) = 0;
    }
    auVar22 = auVar33 ^ auVar3;
    iVar6 = auVar22._0_4_;
    iVar28 = auVar22._8_4_;
    auVar32._4_4_ = iVar6;
    auVar32._0_4_ = iVar6;
    auVar32._8_4_ = iVar28;
    auVar32._12_4_ = iVar28;
    auVar41._0_4_ = -(uint)(iVar6 < -0x7ffffee2);
    auVar41._4_4_ = -(uint)(iVar6 < -0x7ffffee2);
    auVar41._8_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar41._12_4_ = -(uint)(iVar28 < -0x7ffffee2);
    auVar26._0_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar26._4_4_ = -(uint)(auVar22._4_4_ == -0x80000000);
    auVar26._8_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar26._12_4_ = -(uint)(auVar22._12_4_ == -0x80000000);
    auVar26 = auVar26 & auVar41;
    auVar22 = packssdw(auVar32,auVar26);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)s + lVar10 * 4 + -4) = 0;
    }
    auVar22 = pshufhw(auVar26,auVar26,0x84);
    auVar22 = packssdw(auVar22,auVar22);
    if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined2 *)((long)&s->strm + lVar10 * 4) = 0;
    }
    lVar14 = auVar20._8_8_;
    auVar20._0_8_ = auVar20._0_8_ + 8;
    auVar20._8_8_ = lVar14 + 8;
    lVar14 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 8;
    auVar18._8_8_ = lVar14 + 8;
    lVar14 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 8;
    auVar16._8_8_ = lVar14 + 8;
    lVar14 = auVar33._8_8_;
    auVar33._0_8_ = auVar33._0_8_ + 8;
    auVar33._8_8_ = lVar14 + 8;
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x168);
  lVar10 = 0;
  auVar22 = _DAT_0011b170;
  auVar17 = _DAT_0011b180;
  auVar19 = _DAT_0011a3f0;
  auVar21 = _DAT_0011a400;
  do {
    auVar33 = auVar21 ^ auVar3;
    auVar42._0_4_ = -(uint)(auVar33._0_4_ < -0x7fffffe2);
    auVar42._4_4_ = -(uint)(auVar33._0_4_ < -0x7fffffe2);
    auVar42._8_4_ = -(uint)(auVar33._8_4_ < -0x7fffffe2);
    auVar42._12_4_ = -(uint)(auVar33._8_4_ < -0x7fffffe2);
    auVar34._0_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar34._4_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar34._8_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar34._12_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar34 = auVar34 & auVar42;
    auVar33 = pshuflw(auVar42,auVar34,0xe8);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar10].fc.freq = 0;
    }
    auVar33 = packssdw(auVar34,auVar34);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33._0_4_ >> 0x10 & 1) != 0) {
      s->dyn_dtree[lVar10 + 1].fc.freq = 0;
    }
    auVar33 = auVar19 ^ auVar3;
    iVar6 = auVar33._0_4_;
    iVar28 = auVar33._8_4_;
    auVar43._4_4_ = iVar6;
    auVar43._0_4_ = iVar6;
    auVar43._8_4_ = iVar28;
    auVar43._12_4_ = iVar28;
    auVar45._0_4_ = -(uint)(iVar6 < -0x7fffffe2);
    auVar45._4_4_ = -(uint)(iVar6 < -0x7fffffe2);
    auVar45._8_4_ = -(uint)(iVar28 < -0x7fffffe2);
    auVar45._12_4_ = -(uint)(iVar28 < -0x7fffffe2);
    auVar35._0_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar35._4_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar35._8_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar35._12_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar35 = auVar35 & auVar45;
    auVar33 = packssdw(auVar43,auVar35);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar10 + 2].fc.freq = 0;
    }
    auVar33 = pshufhw(auVar35,auVar35,0x84);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar10 + 3].fc.freq = 0;
    }
    auVar33 = auVar17 ^ auVar3;
    iVar6 = auVar33._0_4_;
    iVar28 = auVar33._8_4_;
    auVar44._4_4_ = iVar6;
    auVar44._0_4_ = iVar6;
    auVar44._8_4_ = iVar28;
    auVar44._12_4_ = iVar28;
    auVar46._0_4_ = -(uint)(iVar6 < -0x7fffffe2);
    auVar46._4_4_ = -(uint)(iVar6 < -0x7fffffe2);
    auVar46._8_4_ = -(uint)(iVar28 < -0x7fffffe2);
    auVar46._12_4_ = -(uint)(iVar28 < -0x7fffffe2);
    auVar36._0_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar36._4_4_ = -(uint)(auVar33._4_4_ == -0x80000000);
    auVar36._8_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar36._12_4_ = -(uint)(auVar33._12_4_ == -0x80000000);
    auVar36 = auVar36 & auVar46;
    auVar33 = pshuflw(auVar44,auVar36,0xe8);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar10 + 4].fc.freq = 0;
    }
    auVar33 = packssdw(auVar36,auVar36);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar10 + 5].fc.freq = 0;
    }
    auVar33 = auVar22 ^ auVar3;
    auVar37._4_4_ = auVar33._4_4_;
    auVar37._12_4_ = auVar33._12_4_;
    auVar47._0_4_ = -(uint)(auVar33._0_4_ < -0x7fffffe2);
    auVar47._4_4_ = -(uint)(auVar33._0_4_ < -0x7fffffe2);
    auVar47._8_4_ = -(uint)(auVar33._8_4_ < -0x7fffffe2);
    auVar47._12_4_ = -(uint)(auVar33._8_4_ < -0x7fffffe2);
    auVar37._0_4_ = auVar37._4_4_;
    auVar37._8_4_ = auVar37._12_4_;
    auVar27._0_4_ = -(uint)(auVar37._4_4_ == -0x80000000);
    auVar27._4_4_ = -(uint)(auVar37._4_4_ == -0x80000000);
    auVar27._8_4_ = -(uint)(auVar37._12_4_ == -0x80000000);
    auVar27._12_4_ = -(uint)(auVar37._12_4_ == -0x80000000);
    auVar27 = auVar27 & auVar47;
    auVar33 = packssdw(auVar37,auVar27);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar10 + 6].fc.freq = 0;
    }
    auVar33 = pshufhw(auVar27,auVar27,0x84);
    auVar33 = packssdw(auVar33,auVar33);
    if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      s->dyn_dtree[lVar10 + 7].fc.freq = 0;
    }
    lVar10 = lVar10 + 8;
    lVar14 = auVar21._8_8_;
    auVar21._0_8_ = auVar21._0_8_ + 8;
    auVar21._8_8_ = lVar14 + 8;
    lVar14 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 8;
    auVar19._8_8_ = lVar14 + 8;
    lVar14 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 8;
    auVar17._8_8_ = lVar14 + 8;
    lVar14 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 8;
    auVar22._8_8_ = lVar14 + 8;
  } while (lVar10 != 0x20);
  lVar10 = 0;
  auVar13 = _DAT_0011a3f0;
  auVar15 = _DAT_0011a400;
  do {
    if (SUB164(auVar15 ^ auVar3,4) == -0x80000000 && SUB164(auVar15 ^ auVar3,0) < -0x7fffffed) {
      s->bl_tree[lVar10].fc.freq = 0;
      s->bl_tree[lVar10 + 1].fc.freq = 0;
    }
    if (SUB164(auVar13 ^ auVar3,4) == -0x80000000 && SUB164(auVar13 ^ auVar3,0) < -0x7fffffed) {
      s->bl_tree[lVar10 + 2].fc.freq = 0;
      s->bl_tree[lVar10 + 3].fc.freq = 0;
    }
    lVar10 = lVar10 + 4;
    lVar14 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 4;
    auVar15._8_8_ = lVar14 + 4;
    lVar14 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 4;
    auVar13._8_8_ = lVar14 + 4;
  } while (lVar10 != 0x14);
  s->dyn_ltree[0x100].fc.freq = 1;
  s->sym_next = 0;
  s->opt_len = 0;
  s->static_len = 0;
  s->matches = 0;
  if (last != 0) {
    iVar6 = s->bi_valid;
    if (iVar6 < 0x39) {
      if (0x18 < iVar6) {
        *(int *)(s->pending_buf + s->pending) = (int)s->bi_buf;
        s->pending = s->pending + 4;
        s->bi_buf = (ulong)*(uint *)((long)&s->bi_buf + 4);
        iVar6 = s->bi_valid + -0x20;
        s->bi_valid = iVar6;
      }
      if (8 < iVar6) {
        *(short *)(s->pending_buf + s->pending) = (short)s->bi_buf;
        s->pending = s->pending + 2;
        s->bi_buf = s->bi_buf >> 0x10;
        iVar6 = s->bi_valid + -0x10;
      }
      if (0 < iVar6) {
        uVar11 = s->pending;
        s->pending = uVar11 + 1;
        s->pending_buf[uVar11] = (uchar)s->bi_buf;
      }
    }
    else {
      *(uint64_t *)(s->pending_buf + s->pending) = s->bi_buf;
      s->pending = s->pending + 8;
    }
    s->bi_buf = 0;
    s->bi_valid = 0;
  }
  return;
}

Assistant:

void Z_INTERNAL zng_tr_flush_block(deflate_state *s, char *buf, uint32_t stored_len, int last) {
    /* buf: input block, or NULL if too old */
    /* stored_len: length of input block */
    /* last: one if this is the last block for a file */
    unsigned long opt_lenb, static_lenb; /* opt_len and static_len in bytes */
    int max_blindex = 0;  /* index of last bit length code of non zero freq */

    /* Build the Huffman trees unless a stored block is forced */
    if (UNLIKELY(s->sym_next == 0)) {
        /* Emit an empty static tree block with no codes */
        opt_lenb = static_lenb = 0;
        s->static_len = 7;
    } else if (s->level > 0) {
        /* Check if the file is binary or text */
        if (s->strm->data_type == Z_UNKNOWN)
            s->strm->data_type = detect_data_type(s);

        /* Construct the literal and distance trees */
        build_tree(s, (tree_desc *)(&(s->l_desc)));
        Tracev((stderr, "\nlit data: dyn %lu, stat %lu", s->opt_len, s->static_len));

        build_tree(s, (tree_desc *)(&(s->d_desc)));
        Tracev((stderr, "\ndist data: dyn %lu, stat %lu", s->opt_len, s->static_len));
        /* At this point, opt_len and static_len are the total bit lengths of
         * the compressed block data, excluding the tree representations.
         */

        /* Build the bit length tree for the above two trees, and get the index
         * in bl_order of the last bit length code to send.
         */
        max_blindex = build_bl_tree(s);

        /* Determine the best encoding. Compute the block lengths in bytes. */
        opt_lenb = (s->opt_len+3+7) >> 3;
        static_lenb = (s->static_len+3+7) >> 3;

        Tracev((stderr, "\nopt %lu(%lu) stat %lu(%lu) stored %u lit %u ",
                opt_lenb, s->opt_len, static_lenb, s->static_len, stored_len,
                s->sym_next / 3));

        if (static_lenb <= opt_lenb || s->strategy == Z_FIXED)
            opt_lenb = static_lenb;

    } else {
        Assert(buf != NULL, "lost buf");
        opt_lenb = static_lenb = stored_len + 5; /* force a stored block */
    }

    if (stored_len+4 <= opt_lenb && buf != NULL) {
        /* 4: two words for the lengths
         * The test buf != NULL is only necessary if LIT_BUFSIZE > WSIZE.
         * Otherwise we can't have processed more than WSIZE input bytes since
         * the last block flush, because compression would have been
         * successful. If LIT_BUFSIZE <= WSIZE, it is never too late to
         * transform a block into a stored block.
         */
        zng_tr_stored_block(s, buf, stored_len, last);

    } else if (static_lenb == opt_lenb) {
        zng_tr_emit_tree(s, STATIC_TREES, last);
        compress_block(s, (const ct_data *)static_ltree, (const ct_data *)static_dtree);
        cmpr_bits_add(s, s->static_len);
    } else {
        zng_tr_emit_tree(s, DYN_TREES, last);
        send_all_trees(s, s->l_desc.max_code+1, s->d_desc.max_code+1, max_blindex+1);
        compress_block(s, (const ct_data *)s->dyn_ltree, (const ct_data *)s->dyn_dtree);
        cmpr_bits_add(s, s->opt_len);
    }
    Assert(s->compressed_len == s->bits_sent, "bad compressed size");
    /* The above check is made mod 2^32, for files larger than 512 MB
     * and unsigned long implemented on 32 bits.
     */
    init_block(s);

    if (last) {
        zng_tr_emit_align(s);
    }
    Tracev((stderr, "\ncomprlen %lu(%lu) ", s->compressed_len>>3, s->compressed_len-7*last));
}